

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_spec_constant_default_value_pass.h
# Opt level: O2

void __thiscall
spvtools::opt::SetSpecConstantDefaultValuePass::SetSpecConstantDefaultValuePass
          (SetSpecConstantDefaultValuePass *this,SpecIdToValueStrMap *default_values)

{
  Pass::Pass(&this->super_Pass);
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__SetSpecConstantDefaultValuePass_00a68778;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&(this->spec_id_to_value_str_)._M_h,&default_values->_M_h);
  *(undefined8 *)&(this->spec_id_to_value_bit_pattern_)._M_h._M_rehash_policy = 0;
  (this->spec_id_to_value_bit_pattern_)._M_h._M_buckets =
       &(this->spec_id_to_value_bit_pattern_)._M_h._M_single_bucket;
  (this->spec_id_to_value_bit_pattern_)._M_h._M_bucket_count = 1;
  (this->spec_id_to_value_bit_pattern_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->spec_id_to_value_bit_pattern_)._M_h._M_element_count = 0;
  (this->spec_id_to_value_bit_pattern_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->spec_id_to_value_bit_pattern_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->spec_id_to_value_bit_pattern_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

explicit SetSpecConstantDefaultValuePass(
      const SpecIdToValueStrMap& default_values)
      : spec_id_to_value_str_(default_values),
        spec_id_to_value_bit_pattern_() {}